

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-base64X.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
YukiWorkshop::Base64X::Decoder<std::__cxx11::string>::decode<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,void *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__input)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __decode_to_target((Decoder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)this,__return_storage_ptr__,(__input->_M_dataplus)._M_p,
                     __input->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

T decode(const T2& __input) {
			T ret;
			__decode_to_target(*this, ret, __input.data(), __input.size());
			return ret;
		}